

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O0

Aig_Man_t * generateGeneralDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combK)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *p1;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *vDisj_nCk;
  Vec_Ptr_t *vPODriver_nCk;
  Vec_Ptr_t *vLO_nCk;
  Aig_Obj_t *pObjDisj_nCk;
  Aig_Obj_t *pObjLO_nCk;
  Aig_Obj_t *pObj;
  long lCombinationCount;
  long longI;
  int combK_internal;
  int combN_internal;
  int nRegCount;
  int i;
  int poCopied;
  int liCreated;
  int liCopied;
  int loCreated;
  int loCopied;
  int piCopied;
  Aig_Man_t *pNewAig;
  int combK_local;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  liCopied = 0;
  liCreated = 0;
  poCopied = 0;
  i = 0;
  iVar1 = Aig_ManRegNum(pAig);
  iVar2 = Aig_ManObjNumMax(pAig);
  p_00 = Aig_ManStart(iVar2);
  sVar4 = strlen(pAig->pName);
  pcVar5 = (char *)malloc(sVar4 + 5);
  p_00->pName = pcVar5;
  sprintf(p_00->pName,"%s_%s",pAig->pName,"nCk");
  p_00->pSpec = (char *)0x0;
  pAVar6 = Aig_ManConst1(pAig);
  pAVar7 = Aig_ManConst1(p_00);
  (pAVar6->field_5).pData = pAVar7;
  for (combN_internal = 0; iVar2 = Saig_ManPiNum(pAig), combN_internal < iVar2;
      combN_internal = combN_internal + 1) {
    pvVar8 = Vec_PtrEntry(pAig->vCis,combN_internal);
    pAVar6 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  for (combN_internal = 0; iVar2 = Saig_ManRegNum(pAig), combN_internal < iVar2;
      combN_internal = combN_internal + 1) {
    pVVar10 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar8 = Vec_PtrEntry(pVVar10,combN_internal + iVar2);
    liCopied = liCopied + 1;
    pAVar6 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  pObj = (Aig_Obj_t *)0x0;
  for (longI._0_4_ = 1; (int)longI <= combK; longI._0_4_ = (int)longI + 1) {
    lVar9 = countCombination((long)iVar1,(long)(int)longI);
    pObj = (Aig_Obj_t *)((long)&pObj->field_0 + lVar9);
  }
  if ((long)pObj < 1) {
    __assert_fail("lCombinationCount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                  ,0x181,
                  "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
  }
  iVar2 = (int)pObj;
  pVVar10 = Vec_PtrAlloc(iVar2);
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    liCreated = liCreated + 1;
    pAVar6 = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(pVVar10,pAVar6);
  }
  for (combN_internal = 0; iVar3 = Vec_PtrSize(pAig->vObjs), combN_internal < iVar3;
      combN_internal = combN_internal + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,combN_internal);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      p1 = Aig_ObjChild1Copy(pAVar6);
      pAVar7 = Aig_And(p_00,pAVar7,p1);
      (pAVar6->field_5).pData = pAVar7;
    }
  }
  p_01 = Vec_PtrAlloc(iVar2);
  for (longI._0_4_ = 1; (int)longI <= combK; longI._0_4_ = (int)longI + 1) {
    generateCombinatorialStabilExhaust(p_00,pAig,p_01,iVar1,(int)longI);
  }
  p_02 = Vec_PtrAlloc(iVar2);
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar10,(int)lCombinationCount);
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p_01,(int)lCombinationCount);
    pAVar7 = Aig_Not(pAVar7);
    pAVar6 = Aig_Or(p_00,pAVar7,pAVar6);
    Vec_PtrPush(p_02,pAVar6);
  }
  for (combN_internal = 0; iVar1 = Saig_ManPoNum(pAig), combN_internal < iVar1;
      combN_internal = combN_internal + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,combN_internal);
    pAVar7 = Aig_ObjChild0Copy(pAVar6);
    pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
    (pAVar6->field_5).pData = pAVar7;
  }
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_02,(int)lCombinationCount);
    Aig_ObjCreateCo(p_00,pAVar6);
  }
  for (combN_internal = 0; iVar1 = Saig_ManRegNum(pAig), combN_internal < iVar1;
      combN_internal = combN_internal + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p,combN_internal + iVar1);
    poCopied = poCopied + 1;
    pAVar6 = Aig_ObjChild0Copy(pAVar6);
    Aig_ObjCreateCo(p_00,pAVar6);
  }
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    i = i + 1;
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_02,(int)lCombinationCount);
    Aig_ObjCreateCo(p_00,pAVar6);
  }
  if (poCopied + i == liCopied + liCreated) {
    Aig_ManSetRegNum(p_00,liCopied + liCreated);
    Aig_ManCleanup(p_00);
    iVar1 = Aig_ManCheck(p_00);
    if (iVar1 != 0) {
      Vec_PtrFree(pVVar10);
      Vec_PtrFree(p_02);
      Vec_PtrFree(p_01);
      return p_00;
    }
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                  ,0x1c6,
                  "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
  }
  __assert_fail("liCopied + liCreated == loCopied + loCreated",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                ,0x1c1,"Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)")
  ;
}

Assistant:

Aig_Man_t *generateGeneralDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combK )
{
	//AIG creation related data structure
	Aig_Man_t *pNewAig;
	int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
	//int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int i, nRegCount;
	int combN_internal, combK_internal; //, targetPoIndex;
	long longI, lCombinationCount;
	//Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
	Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
	Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;

	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
	
	//Knuth's Data Strcuture
	//Vec_Int_t *vC_KNUTH;
	//int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

	//Collecting target HINT signals
	//vCandidateMonotoneSignals = findHintOutputs(pNtk);
	//if( vCandidateMonotoneSignals == NULL )
	//{
	//	printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
	//	combN_internal = 0;
	//}
	//else
	//{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
	//	hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
	//	hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
	//	combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
	//}

	combN_internal = Aig_ManRegNum(pAig);

	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
    	pNewAig->pSpec = NULL;

	//Standard Mapping of Constant Nodes
	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//Standard AIG PI duplication
	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//Standard AIG LO duplication
	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//nCk LO creation
	lCombinationCount = 0;
	for(combK_internal=1; combK_internal<=combK; combK_internal++)
		lCombinationCount += countCombination( combN_internal, combK_internal );
	assert( lCombinationCount > 0 );
	vLO_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		loCreated++;
		pObj = Aig_ObjCreateCi(pNewAig);
		Vec_PtrPush( vLO_nCk, pObj );
	}

	//Standard Node duplication
	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//nCk specific logic creation (i.e. nCk number of OR gates)
	vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

	for( combK_internal=1; combK_internal<=combK; combK_internal++ )
	{
		generateCombinatorialStabilExhaust( pNewAig, pAig,
				vDisj_nCk, combN_internal, combK_internal );
	}


	//creation of implication logic
	vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
		pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

		pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
		Vec_PtrPush(vPODriver_nCk, pObj);
	}
	
	//Standard PO duplication
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	//nCk specific PO creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//Standard LI duplication
	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//nCk specific LI creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//clean-up, book-keeping
	assert( liCopied + liCreated == loCopied + loCreated );	
	nRegCount = loCopied + loCreated;

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	assert( Aig_ManCheck( pNewAig ) );
	
	Vec_PtrFree(vLO_nCk);
	Vec_PtrFree(vPODriver_nCk);
	Vec_PtrFree(vDisj_nCk);
	//Vec_IntFree(vC_KNUTH);	
	return pNewAig;
}